

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O1

CURLcode Curl_senddata(Curl_easy *data,void *buffer,size_t buflen,size_t *n)

{
  CURLcode CVar1;
  CURLcode CVar2;
  connectdata *c;
  sigpipe_ignore pipe_st;
  connectdata *local_d0;
  sigpipe_ignore local_c8;
  
  local_d0 = (connectdata *)0x0;
  *n = 0;
  CVar1 = easy_connection(data,&local_d0);
  if (CVar1 == CURLE_OK) {
    if (data->conn == (connectdata *)0x0) {
      Curl_attach_connection(data,local_d0);
    }
    sigpipe_ignore(data,&local_c8);
    CVar2 = Curl_conn_send(data,0,buffer,buflen,false,n);
    if ((local_c8._152_1_ & 1) == 0) {
      sigaction(0xd,(sigaction *)&local_c8,(sigaction *)0x0);
    }
    CVar1 = CURLE_SEND_ERROR;
    if (CVar2 == CURLE_OK) {
      CVar1 = CVar2;
    }
    if (CVar2 == CURLE_AGAIN) {
      CVar1 = CVar2;
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_senddata(struct Curl_easy *data, const void *buffer,
                       size_t buflen, size_t *n)
{
  CURLcode result;
  struct connectdata *c = NULL;
  SIGPIPE_VARIABLE(pipe_st);

  *n = 0;
  result = easy_connection(data, &c);
  if(result)
    return result;

  if(!data->conn)
    /* on first invoke, the transfer has been detached from the connection and
       needs to be reattached */
    Curl_attach_connection(data, c);

  sigpipe_ignore(data, &pipe_st);
  result = Curl_conn_send(data, FIRSTSOCKET, buffer, buflen, FALSE, n);
  sigpipe_restore(&pipe_st);

  if(result && result != CURLE_AGAIN)
    return CURLE_SEND_ERROR;
  return result;
}